

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_1::UnspecifiedAttachmentTextureComponentTypeCase::test
          (UnspecifiedAttachmentTextureComponentTypeCase *this)

{
  CallLogWrapper *testCtx;
  GLuint pname;
  GLenum reference;
  GLuint textureID;
  GLuint framebufferID;
  
  framebufferID = 0;
  testCtx = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenFramebuffers(testCtx,1,&framebufferID);
  glu::CallLogWrapper::glBindFramebuffer(testCtx,0x8d40,framebufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  textureID = 0;
  glu::CallLogWrapper::glGenTextures(testCtx,1,&textureID);
  glu::CallLogWrapper::glBindTexture(testCtx,0xde1,textureID);
  ApiCase::expectError(&this->super_ApiCase,0);
  reference = 0;
  pname = textureID;
  glu::CallLogWrapper::glFramebufferTexture2D(testCtx,0x8d40,0x8ce0,0xde1,textureID,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkColorAttachmentParam
            ((anon_unknown_1 *)
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (TestContext *)testCtx,(CallLogWrapper *)0x8211,0,pname,reference);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glFramebufferTexture2D(testCtx,0x8d40,0x8ce0,0xde1,0,0);
  glu::CallLogWrapper::glDeleteTextures(testCtx,1,&textureID);
  glu::CallLogWrapper::glDeleteFramebuffers(testCtx,1,&framebufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint framebufferID = 0;
		glGenFramebuffers(1, &framebufferID);
		glBindFramebuffer(GL_FRAMEBUFFER, framebufferID);
		expectError(GL_NO_ERROR);

		{
			GLuint textureID = 0;
			glGenTextures(1, &textureID);
			glBindTexture(GL_TEXTURE_2D, textureID);
			expectError(GL_NO_ERROR);

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, textureID, 0);
			expectError(GL_NO_ERROR);

			checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE, GL_NONE);
			expectError(GL_NO_ERROR);

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
			glDeleteTextures(1, &textureID);
		}

		glDeleteFramebuffers(1, &framebufferID);
		expectError(GL_NO_ERROR);
	}